

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O0

void __thiscall Cgmres<Model1>::Cgmres(Cgmres<Model1> *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  double in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  Gmres *in_stack_ffffffffffffffd0;
  
  Gmres::Gmres(in_stack_ffffffffffffffd0,(uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x30),
               (uint16_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_Ax_func_00108d48;
  in_RDI[8] = 0;
  pvVar1 = operator_new__(0x960);
  in_RDI[9] = pvVar1;
  pvVar1 = operator_new__(0x960);
  in_RDI[10] = pvVar1;
  pvVar1 = operator_new__(0x20);
  in_RDI[0xb] = pvVar1;
  pvVar1 = operator_new__(0x330);
  in_RDI[0xc] = pvVar1;
  pvVar1 = operator_new__(0x960);
  in_RDI[0xd] = pvVar1;
  return;
}

Assistant:

Cgmres(void) : Gmres(len, Model::k_max, Model::tol) {
    t = 0.0;
    U = new double[dim_u * dv];
    dUdt = new double[dim_u * dv];

    x_dxh = new double[dim_x];
    ptau = new double[dim_p * (dv + 1)];

    F_dxh_h = new double[dim_u * dv];
  }